

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 (*pauVar27) [16];
  AABBNodeMB4D *node1;
  ulong uVar28;
  uint uVar29;
  undefined4 uVar30;
  long lVar31;
  ulong uVar32;
  undefined1 auVar33 [8];
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar58;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar56;
  float fVar57;
  undefined1 auVar55 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  float fVar73;
  float fVar83;
  float fVar84;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar85;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar96;
  float fVar97;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar114;
  undefined1 auVar113 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  float fVar117;
  float fVar119;
  uint uVar120;
  float fVar121;
  uint uVar122;
  float fVar123;
  uint uVar124;
  undefined1 auVar118 [64];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1238;
  undefined8 uStack_1230;
  int local_120c;
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  RayQueryContext *local_11b0;
  undefined1 local_11a8 [8];
  float fStack_11a0;
  float fStack_119c;
  ulong local_1198;
  undefined1 (*local_1190) [16];
  long local_1188;
  ulong local_1180;
  ulong local_1178;
  long local_1170;
  RTCFilterFunctionNArguments local_1168;
  float local_1138;
  undefined4 local_1134;
  undefined4 local_1130;
  float local_112c;
  float local_1128;
  undefined4 local_1124;
  uint local_1120;
  uint local_111c;
  uint local_1118;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_1098 [16];
  float local_1088 [4];
  float local_1078 [4];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_1190 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar74 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar47 = (ray->super_RayK<1>).tfar;
    auVar72 = ZEXT464((uint)fVar47);
    auVar59 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar47));
    auVar92._8_4_ = 0x7fffffff;
    auVar92._0_8_ = 0x7fffffff7fffffff;
    auVar92._12_4_ = 0x7fffffff;
    auVar92 = vandps_avx((undefined1  [16])aVar4,auVar92);
    auVar106._8_4_ = 0x219392ef;
    auVar106._0_8_ = 0x219392ef219392ef;
    auVar106._12_4_ = 0x219392ef;
    auVar92 = vcmpps_avx(auVar92,auVar106,1);
    auVar92 = vblendvps_avx((undefined1  [16])aVar4,auVar106,auVar92);
    auVar106 = vrcpps_avx(auVar92);
    fVar47 = auVar106._0_4_;
    auVar87._0_4_ = auVar92._0_4_ * fVar47;
    fVar56 = auVar106._4_4_;
    auVar87._4_4_ = auVar92._4_4_ * fVar56;
    fVar57 = auVar106._8_4_;
    auVar87._8_4_ = auVar92._8_4_ * fVar57;
    fVar58 = auVar106._12_4_;
    auVar87._12_4_ = auVar92._12_4_ * fVar58;
    auVar107._8_4_ = 0x3f800000;
    auVar107._0_8_ = 0x3f8000003f800000;
    auVar107._12_4_ = 0x3f800000;
    auVar92 = vsubps_avx(auVar107,auVar87);
    auVar88._0_4_ = fVar47 + fVar47 * auVar92._0_4_;
    auVar88._4_4_ = fVar56 + fVar56 * auVar92._4_4_;
    auVar88._8_4_ = fVar57 + fVar57 * auVar92._8_4_;
    auVar88._12_4_ = fVar58 + fVar58 * auVar92._12_4_;
    uVar30 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_fc8._4_4_ = uVar30;
    local_fc8._0_4_ = uVar30;
    local_fc8._8_4_ = uVar30;
    local_fc8._12_4_ = uVar30;
    auVar113 = ZEXT1664(local_fc8);
    uVar30 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_fd8._4_4_ = uVar30;
    local_fd8._0_4_ = uVar30;
    local_fd8._8_4_ = uVar30;
    local_fd8._12_4_ = uVar30;
    auVar116 = ZEXT1664(local_fd8);
    uVar30 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_fe8._4_4_ = uVar30;
    local_fe8._0_4_ = uVar30;
    local_fe8._8_4_ = uVar30;
    local_fe8._12_4_ = uVar30;
    auVar118 = ZEXT1664(local_fe8);
    local_ff8 = vshufps_avx(auVar88,auVar88,0);
    auVar126 = ZEXT1664(local_ff8);
    auVar92 = vmovshdup_avx(auVar88);
    local_1008 = vshufps_avx(auVar88,auVar88,0x55);
    auVar131 = ZEXT1664(local_1008);
    auVar106 = vshufpd_avx(auVar88,auVar88,1);
    uVar32 = (ulong)(auVar88._0_4_ < 0.0) << 4;
    local_1018 = vshufps_avx(auVar88,auVar88,0xaa);
    auVar133 = ZEXT1664(local_1018);
    uVar39 = (ulong)(auVar92._0_4_ < 0.0) << 4 | 0x20;
    uVar45 = (ulong)(auVar106._0_4_ < 0.0) << 4 | 0x40;
    uVar46 = uVar32 ^ 0x10;
    local_1028 = vshufps_avx(auVar74,auVar74,0);
    auVar134 = ZEXT1664(local_1028);
    auVar92 = vshufps_avx(auVar59,auVar59,0);
    auVar55 = ZEXT1664(auVar92);
    local_1108 = mm_lookupmask_ps._240_8_;
    uStack_1100 = mm_lookupmask_ps._248_8_;
    local_11b0 = context;
    local_1198 = uVar32;
LAB_00b6c132:
    if (local_1190 != (undefined1 (*) [16])&local_f78) {
      pauVar27 = local_1190 + -1;
      local_1190 = local_1190 + -1;
      if (*(float *)(*pauVar27 + 8) <= auVar72._0_4_) {
        uVar34 = *(ulong *)*local_1190;
        while ((uVar34 & 8) == 0) {
          uVar28 = uVar34 & 0xfffffffffffffff0;
          fVar47 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar59._4_4_ = fVar47;
          auVar59._0_4_ = fVar47;
          auVar59._8_4_ = fVar47;
          auVar59._12_4_ = fVar47;
          pfVar3 = (float *)(uVar28 + 0x80 + uVar32);
          pfVar1 = (float *)(uVar28 + 0x20 + uVar32);
          auVar74._0_4_ = fVar47 * *pfVar3 + *pfVar1;
          auVar74._4_4_ = fVar47 * pfVar3[1] + pfVar1[1];
          auVar74._8_4_ = fVar47 * pfVar3[2] + pfVar1[2];
          auVar74._12_4_ = fVar47 * pfVar3[3] + pfVar1[3];
          auVar92 = vsubps_avx(auVar74,auVar113._0_16_);
          auVar75._0_4_ = auVar126._0_4_ * auVar92._0_4_;
          auVar75._4_4_ = auVar126._4_4_ * auVar92._4_4_;
          auVar75._8_4_ = auVar126._8_4_ * auVar92._8_4_;
          auVar75._12_4_ = auVar126._12_4_ * auVar92._12_4_;
          pfVar3 = (float *)(uVar28 + 0x80 + uVar39);
          auVar92 = vmaxps_avx(auVar134._0_16_,auVar75);
          pfVar1 = (float *)(uVar28 + 0x20 + uVar39);
          auVar89._0_4_ = fVar47 * *pfVar3 + *pfVar1;
          auVar89._4_4_ = fVar47 * pfVar3[1] + pfVar1[1];
          auVar89._8_4_ = fVar47 * pfVar3[2] + pfVar1[2];
          auVar89._12_4_ = fVar47 * pfVar3[3] + pfVar1[3];
          auVar74 = vsubps_avx(auVar89,auVar116._0_16_);
          pfVar3 = (float *)(uVar28 + 0x80 + uVar45);
          pfVar1 = (float *)(uVar28 + 0x20 + uVar45);
          auVar99._0_4_ = fVar47 * *pfVar3 + *pfVar1;
          auVar99._4_4_ = fVar47 * pfVar3[1] + pfVar1[1];
          auVar99._8_4_ = fVar47 * pfVar3[2] + pfVar1[2];
          auVar99._12_4_ = fVar47 * pfVar3[3] + pfVar1[3];
          auVar90._0_4_ = auVar131._0_4_ * auVar74._0_4_;
          auVar90._4_4_ = auVar131._4_4_ * auVar74._4_4_;
          auVar90._8_4_ = auVar131._8_4_ * auVar74._8_4_;
          auVar90._12_4_ = auVar131._12_4_ * auVar74._12_4_;
          auVar74 = vsubps_avx(auVar99,auVar118._0_16_);
          auVar100._0_4_ = auVar133._0_4_ * auVar74._0_4_;
          auVar100._4_4_ = auVar133._4_4_ * auVar74._4_4_;
          auVar100._8_4_ = auVar133._8_4_ * auVar74._8_4_;
          auVar100._12_4_ = auVar133._12_4_ * auVar74._12_4_;
          auVar74 = vmaxps_avx(auVar90,auVar100);
          pfVar3 = (float *)(uVar28 + 0x80 + uVar46);
          pfVar1 = (float *)(uVar28 + 0x20 + uVar46);
          auVar101._0_4_ = fVar47 * *pfVar3 + *pfVar1;
          auVar101._4_4_ = fVar47 * pfVar3[1] + pfVar1[1];
          auVar101._8_4_ = fVar47 * pfVar3[2] + pfVar1[2];
          auVar101._12_4_ = fVar47 * pfVar3[3] + pfVar1[3];
          local_10e8 = vmaxps_avx(auVar92,auVar74);
          auVar92 = vsubps_avx(auVar101,auVar113._0_16_);
          auVar91._0_4_ = auVar126._0_4_ * auVar92._0_4_;
          auVar91._4_4_ = auVar126._4_4_ * auVar92._4_4_;
          auVar91._8_4_ = auVar126._8_4_ * auVar92._8_4_;
          auVar91._12_4_ = auVar126._12_4_ * auVar92._12_4_;
          auVar92 = vminps_avx(auVar55._0_16_,auVar91);
          pfVar3 = (float *)(uVar28 + 0x80 + (uVar39 ^ 0x10));
          pfVar1 = (float *)(uVar28 + 0x20 + (uVar39 ^ 0x10));
          auVar102._0_4_ = fVar47 * *pfVar3 + *pfVar1;
          auVar102._4_4_ = fVar47 * pfVar3[1] + pfVar1[1];
          auVar102._8_4_ = fVar47 * pfVar3[2] + pfVar1[2];
          auVar102._12_4_ = fVar47 * pfVar3[3] + pfVar1[3];
          auVar74 = vsubps_avx(auVar102,auVar116._0_16_);
          auVar103._0_4_ = auVar131._0_4_ * auVar74._0_4_;
          auVar103._4_4_ = auVar131._4_4_ * auVar74._4_4_;
          auVar103._8_4_ = auVar131._8_4_ * auVar74._8_4_;
          auVar103._12_4_ = auVar131._12_4_ * auVar74._12_4_;
          pfVar3 = (float *)(uVar28 + 0x80 + (uVar45 ^ 0x10));
          pfVar1 = (float *)(uVar28 + 0x20 + (uVar45 ^ 0x10));
          auVar108._0_4_ = fVar47 * *pfVar3 + *pfVar1;
          auVar108._4_4_ = fVar47 * pfVar3[1] + pfVar1[1];
          auVar108._8_4_ = fVar47 * pfVar3[2] + pfVar1[2];
          auVar108._12_4_ = fVar47 * pfVar3[3] + pfVar1[3];
          auVar74 = vsubps_avx(auVar108,auVar118._0_16_);
          auVar109._0_4_ = auVar133._0_4_ * auVar74._0_4_;
          auVar109._4_4_ = auVar133._4_4_ * auVar74._4_4_;
          auVar109._8_4_ = auVar133._8_4_ * auVar74._8_4_;
          auVar109._12_4_ = auVar133._12_4_ * auVar74._12_4_;
          auVar74 = vminps_avx(auVar103,auVar109);
          auVar92 = vminps_avx(auVar92,auVar74);
          auVar92 = vcmpps_avx(local_10e8,auVar92,2);
          if (((uint)uVar34 & 7) == 6) {
            auVar74 = vcmpps_avx(*(undefined1 (*) [16])(uVar28 + 0xe0),auVar59,2);
            auVar59 = vcmpps_avx(auVar59,*(undefined1 (*) [16])(uVar28 + 0xf0),1);
            auVar74 = vandps_avx(auVar74,auVar59);
            auVar92 = vandps_avx(auVar74,auVar92);
          }
          auVar92 = vpslld_avx(auVar92,0x1f);
          uVar29 = vmovmskps_avx(auVar92);
          if (uVar29 == 0) {
            auVar92 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar72 = ZEXT1664(auVar92);
            goto LAB_00b6c132;
          }
          uVar29 = uVar29 & 0xff;
          lVar42 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
            }
          }
          uVar34 = *(ulong *)(uVar28 + lVar42 * 8);
          uVar29 = uVar29 - 1 & uVar29;
          if (uVar29 != 0) {
            uVar120 = *(uint *)(local_10e8 + lVar42 * 4);
            lVar42 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
              }
            }
            uVar35 = *(ulong *)(uVar28 + lVar42 * 8);
            uVar122 = *(uint *)(local_10e8 + lVar42 * 4);
            uVar29 = uVar29 - 1 & uVar29;
            if (uVar29 == 0) {
              if (uVar120 < uVar122) {
                *(ulong *)*local_1190 = uVar35;
                *(uint *)(*local_1190 + 8) = uVar122;
                local_1190 = local_1190 + 1;
              }
              else {
                *(ulong *)*local_1190 = uVar34;
                *(uint *)(*local_1190 + 8) = uVar120;
                uVar34 = uVar35;
                local_1190 = local_1190 + 1;
              }
            }
            else {
              auVar60._8_8_ = 0;
              auVar60._0_8_ = uVar34;
              auVar92 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar120));
              auVar76._8_8_ = 0;
              auVar76._0_8_ = uVar35;
              auVar74 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar122));
              lVar42 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                }
              }
              auVar93._8_8_ = 0;
              auVar93._0_8_ = *(ulong *)(uVar28 + lVar42 * 8);
              auVar106 = vpunpcklqdq_avx(auVar93,ZEXT416(*(uint *)(local_10e8 + lVar42 * 4)));
              auVar59 = vpcmpgtd_avx(auVar74,auVar92);
              uVar29 = uVar29 - 1 & uVar29;
              if (uVar29 == 0) {
                auVar87 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar74,auVar92,auVar87);
                auVar92 = vblendvps_avx(auVar92,auVar74,auVar87);
                auVar74 = vpcmpgtd_avx(auVar106,auVar59);
                auVar87 = vpshufd_avx(auVar74,0xaa);
                auVar74 = vblendvps_avx(auVar106,auVar59,auVar87);
                auVar59 = vblendvps_avx(auVar59,auVar106,auVar87);
                auVar106 = vpcmpgtd_avx(auVar59,auVar92);
                auVar87 = vpshufd_avx(auVar106,0xaa);
                auVar106 = vblendvps_avx(auVar59,auVar92,auVar87);
                auVar92 = vblendvps_avx(auVar92,auVar59,auVar87);
                *local_1190 = auVar92;
                local_1190[1] = auVar106;
                uVar34 = auVar74._0_8_;
                local_1190 = local_1190 + 2;
              }
              else {
                lVar42 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                  }
                }
                auVar110._8_8_ = 0;
                auVar110._0_8_ = *(ulong *)(uVar28 + lVar42 * 8);
                auVar88 = vpunpcklqdq_avx(auVar110,ZEXT416(*(uint *)(local_10e8 + lVar42 * 4)));
                auVar87 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar74,auVar92,auVar87);
                auVar92 = vblendvps_avx(auVar92,auVar74,auVar87);
                auVar74 = vpcmpgtd_avx(auVar88,auVar106);
                auVar87 = vpshufd_avx(auVar74,0xaa);
                auVar74 = vblendvps_avx(auVar88,auVar106,auVar87);
                auVar106 = vblendvps_avx(auVar106,auVar88,auVar87);
                auVar87 = vpcmpgtd_avx(auVar106,auVar92);
                auVar88 = vpshufd_avx(auVar87,0xaa);
                auVar87 = vblendvps_avx(auVar106,auVar92,auVar88);
                auVar92 = vblendvps_avx(auVar92,auVar106,auVar88);
                auVar106 = vpcmpgtd_avx(auVar74,auVar59);
                auVar88 = vpshufd_avx(auVar106,0xaa);
                auVar106 = vblendvps_avx(auVar74,auVar59,auVar88);
                auVar74 = vblendvps_avx(auVar59,auVar74,auVar88);
                auVar59 = vpcmpgtd_avx(auVar87,auVar74);
                auVar88 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar87,auVar74,auVar88);
                auVar74 = vblendvps_avx(auVar74,auVar87,auVar88);
                *local_1190 = auVar92;
                local_1190[1] = auVar74;
                local_1190[2] = auVar59;
                uVar34 = auVar106._0_8_;
                local_1190 = local_1190 + 3;
              }
            }
          }
        }
        local_1188 = (ulong)((uint)uVar34 & 0xf) - 8;
        uVar34 = uVar34 & 0xfffffffffffffff0;
        for (local_1170 = 0; local_1170 != local_1188; local_1170 = local_1170 + 1) {
          lVar43 = local_1170 * 0x50;
          pSVar7 = context->scene;
          pGVar8 = (pSVar7->geometries).items[*(uint *)(uVar34 + 0x30 + lVar43)].ptr;
          fVar47 = (pGVar8->time_range).lower;
          fVar47 = pGVar8->fnumTimeSegments *
                   (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar47) /
                   ((pGVar8->time_range).upper - fVar47));
          auVar92 = vroundss_avx(ZEXT416((uint)fVar47),ZEXT416((uint)fVar47),9);
          auVar92 = vminss_avx(auVar92,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
          auVar100 = vmaxss_avx(ZEXT816(0),auVar92);
          lVar31 = (long)(int)auVar100._0_4_ * 0x38;
          uVar44 = (ulong)*(uint *)(uVar34 + 4 + lVar43);
          lVar42 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar31);
          lVar31 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar31);
          auVar92 = *(undefined1 (*) [16])(lVar42 + (ulong)*(uint *)(uVar34 + lVar43) * 4);
          uVar28 = (ulong)*(uint *)(uVar34 + 0x10 + lVar43);
          auVar74 = *(undefined1 (*) [16])(lVar42 + uVar28 * 4);
          uVar35 = (ulong)*(uint *)(uVar34 + 0x20 + lVar43);
          auVar102 = *(undefined1 (*) [16])(lVar42 + uVar35 * 4);
          auVar59 = *(undefined1 (*) [16])(lVar42 + uVar44 * 4);
          uVar36 = (ulong)*(uint *)(uVar34 + 0x14 + lVar43);
          auVar106 = *(undefined1 (*) [16])(lVar42 + uVar36 * 4);
          uVar37 = (ulong)*(uint *)(uVar34 + 0x24 + lVar43);
          auVar103 = *(undefined1 (*) [16])(lVar42 + uVar37 * 4);
          uVar38 = (ulong)*(uint *)(uVar34 + 8 + lVar43);
          auVar87 = *(undefined1 (*) [16])(lVar42 + uVar38 * 4);
          local_1178 = (ulong)*(uint *)(uVar34 + 0x18 + lVar43);
          auVar88 = *(undefined1 (*) [16])(lVar42 + local_1178 * 4);
          uVar40 = (ulong)*(uint *)(uVar34 + 0x28 + lVar43);
          auVar107 = *(undefined1 (*) [16])(lVar42 + uVar40 * 4);
          uVar41 = (ulong)*(uint *)(uVar34 + 0xc + lVar43);
          auVar75 = *(undefined1 (*) [16])(lVar42 + uVar41 * 4);
          local_1180 = (ulong)*(uint *)(uVar34 + 0x1c + lVar43);
          auVar89 = *(undefined1 (*) [16])(lVar42 + local_1180 * 4);
          uVar32 = (ulong)*(uint *)(uVar34 + 0x2c + lVar43);
          auVar90 = *(undefined1 (*) [16])(lVar42 + uVar32 * 4);
          auVar91 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar34 + lVar43) * 4);
          auVar99 = *(undefined1 (*) [16])(lVar31 + uVar28 * 4);
          fVar47 = fVar47 - auVar100._0_4_;
          auVar100 = vunpcklps_avx(auVar92,auVar87);
          auVar87 = vunpckhps_avx(auVar92,auVar87);
          auVar101 = vunpcklps_avx(auVar59,auVar75);
          auVar59 = vunpckhps_avx(auVar59,auVar75);
          auVar92 = *(undefined1 (*) [16])(lVar31 + uVar44 * 4);
          _local_fa8 = vunpcklps_avx(auVar87,auVar59);
          auVar93 = _local_fa8;
          auVar75 = vunpcklps_avx(auVar100,auVar101);
          auVar87 = vunpckhps_avx(auVar100,auVar101);
          auVar100 = vunpcklps_avx(auVar74,auVar88);
          auVar59 = vunpckhps_avx(auVar74,auVar88);
          auVar88 = vunpcklps_avx(auVar106,auVar89);
          auVar106 = vunpckhps_avx(auVar106,auVar89);
          auVar74 = *(undefined1 (*) [16])(lVar31 + uVar38 * 4);
          auVar89 = vunpcklps_avx(auVar59,auVar106);
          auVar101 = vunpcklps_avx(auVar100,auVar88);
          _local_fb8 = vunpckhps_avx(auVar100,auVar88);
          auVar76 = _local_fb8;
          auVar100 = vunpcklps_avx(auVar102,auVar107);
          auVar106 = vunpckhps_avx(auVar102,auVar107);
          auVar107 = vunpcklps_avx(auVar103,auVar90);
          auVar88 = vunpckhps_avx(auVar103,auVar90);
          auVar59 = *(undefined1 (*) [16])(lVar31 + uVar41 * 4);
          auVar90 = vunpcklps_avx(auVar106,auVar88);
          _local_f98 = vunpcklps_avx(auVar100,auVar107);
          auVar110 = _local_f98;
          _local_11a8 = vunpckhps_avx(auVar100,auVar107);
          auVar60 = _local_11a8;
          auVar106 = vunpcklps_avx(auVar91,auVar74);
          auVar74 = vunpckhps_avx(auVar91,auVar74);
          auVar88 = vunpcklps_avx(auVar92,auVar59);
          auVar59 = vunpckhps_avx(auVar92,auVar59);
          auVar92 = *(undefined1 (*) [16])(lVar31 + local_1178 * 4);
          auVar107 = vunpcklps_avx(auVar74,auVar59);
          auVar91 = vunpcklps_avx(auVar106,auVar88);
          auVar59 = vunpckhps_avx(auVar106,auVar88);
          auVar88 = vunpcklps_avx(auVar99,auVar92);
          auVar106 = vunpckhps_avx(auVar99,auVar92);
          auVar92 = *(undefined1 (*) [16])(lVar31 + uVar36 * 4);
          auVar74 = *(undefined1 (*) [16])(lVar31 + local_1180 * 4);
          auVar99 = vunpcklps_avx(auVar92,auVar74);
          auVar92 = vunpckhps_avx(auVar92,auVar74);
          auVar100 = vunpcklps_avx(auVar106,auVar92);
          auVar102 = vunpcklps_avx(auVar88,auVar99);
          auVar106 = vunpckhps_avx(auVar88,auVar99);
          auVar92 = *(undefined1 (*) [16])(lVar31 + uVar35 * 4);
          auVar74 = *(undefined1 (*) [16])(lVar31 + uVar40 * 4);
          auVar99 = vunpcklps_avx(auVar92,auVar74);
          auVar88 = vunpckhps_avx(auVar92,auVar74);
          auVar92 = *(undefined1 (*) [16])(lVar31 + uVar37 * 4);
          auVar74 = *(undefined1 (*) [16])(lVar31 + uVar32 * 4);
          auVar103 = vunpcklps_avx(auVar92,auVar74);
          auVar92 = vunpckhps_avx(auVar92,auVar74);
          auVar108 = vunpcklps_avx(auVar88,auVar92);
          auVar109 = vunpcklps_avx(auVar99,auVar103);
          auVar88 = vunpckhps_avx(auVar99,auVar103);
          auVar92 = vshufps_avx(ZEXT416((uint)fVar47),ZEXT416((uint)fVar47),0);
          auVar74 = vshufps_avx(ZEXT416((uint)(1.0 - fVar47)),ZEXT416((uint)(1.0 - fVar47)),0);
          fVar47 = auVar92._0_4_;
          fVar56 = auVar92._4_4_;
          fVar57 = auVar92._8_4_;
          fVar58 = auVar92._12_4_;
          fVar114 = auVar74._0_4_;
          fVar135 = auVar74._4_4_;
          fVar136 = auVar74._8_4_;
          fVar137 = auVar74._12_4_;
          auVar111._0_4_ = fVar114 * auVar75._0_4_ + fVar47 * auVar91._0_4_;
          auVar111._4_4_ = fVar135 * auVar75._4_4_ + fVar56 * auVar91._4_4_;
          auVar111._8_4_ = fVar136 * auVar75._8_4_ + fVar57 * auVar91._8_4_;
          auVar111._12_4_ = fVar137 * auVar75._12_4_ + fVar58 * auVar91._12_4_;
          auVar112._0_4_ = fVar114 * auVar87._0_4_ + fVar47 * auVar59._0_4_;
          auVar112._4_4_ = fVar135 * auVar87._4_4_ + fVar56 * auVar59._4_4_;
          auVar112._8_4_ = fVar136 * auVar87._8_4_ + fVar57 * auVar59._8_4_;
          auVar112._12_4_ = fVar137 * auVar87._12_4_ + fVar58 * auVar59._12_4_;
          auVar104._0_4_ = fVar114 * (float)local_fa8._0_4_ + fVar47 * auVar107._0_4_;
          auVar104._4_4_ = fVar135 * (float)local_fa8._4_4_ + fVar56 * auVar107._4_4_;
          auVar104._8_4_ = fVar136 * fStack_fa0 + fVar57 * auVar107._8_4_;
          auVar104._12_4_ = fVar137 * fStack_f9c + fVar58 * auVar107._12_4_;
          auVar61._0_4_ = fVar114 * auVar101._0_4_ + fVar47 * auVar102._0_4_;
          auVar61._4_4_ = fVar135 * auVar101._4_4_ + fVar56 * auVar102._4_4_;
          auVar61._8_4_ = fVar136 * auVar101._8_4_ + fVar57 * auVar102._8_4_;
          auVar61._12_4_ = fVar137 * auVar101._12_4_ + fVar58 * auVar102._12_4_;
          auVar77._0_4_ = fVar114 * (float)local_fb8._0_4_ + fVar47 * auVar106._0_4_;
          auVar77._4_4_ = fVar135 * (float)local_fb8._4_4_ + fVar56 * auVar106._4_4_;
          auVar77._8_4_ = fVar136 * fStack_fb0 + fVar57 * auVar106._8_4_;
          auVar77._12_4_ = fVar137 * fStack_fac + fVar58 * auVar106._12_4_;
          puVar2 = (undefined8 *)(uVar34 + 0x30 + lVar43);
          local_f88 = *puVar2;
          uStack_f80 = puVar2[1];
          puVar2 = (undefined8 *)(uVar34 + 0x40 + lVar43);
          local_11d8._0_4_ = auVar89._0_4_;
          local_11d8._4_4_ = auVar89._4_4_;
          fStack_11d0 = auVar89._8_4_;
          fStack_11cc = auVar89._12_4_;
          auVar115._0_4_ = fVar114 * (float)local_11d8._0_4_ + auVar100._0_4_ * fVar47;
          auVar115._4_4_ = fVar135 * (float)local_11d8._4_4_ + auVar100._4_4_ * fVar56;
          auVar115._8_4_ = fVar136 * fStack_11d0 + auVar100._8_4_ * fVar57;
          auVar115._12_4_ = fVar137 * fStack_11cc + auVar100._12_4_ * fVar58;
          auVar130._0_4_ = fVar114 * (float)local_f98._0_4_ + auVar109._0_4_ * fVar47;
          auVar130._4_4_ = fVar135 * (float)local_f98._4_4_ + auVar109._4_4_ * fVar56;
          auVar130._8_4_ = fVar136 * fStack_f90 + auVar109._8_4_ * fVar57;
          auVar130._12_4_ = fVar137 * fStack_f8c + auVar109._12_4_ * fVar58;
          auVar132._0_4_ = auVar88._0_4_ * fVar47 + fVar114 * (float)local_11a8._0_4_;
          auVar132._4_4_ = auVar88._4_4_ * fVar56 + fVar135 * (float)local_11a8._4_4_;
          auVar132._8_4_ = auVar88._8_4_ * fVar57 + fVar136 * fStack_11a0;
          auVar132._12_4_ = auVar88._12_4_ * fVar58 + fVar137 * fStack_119c;
          local_11e8._0_4_ = auVar90._0_4_;
          local_11e8._4_4_ = auVar90._4_4_;
          fStack_11e0 = auVar90._8_4_;
          fStack_11dc = auVar90._12_4_;
          auVar48._0_4_ = fVar114 * (float)local_11e8._0_4_ + auVar108._0_4_ * fVar47;
          auVar48._4_4_ = fVar135 * (float)local_11e8._4_4_ + auVar108._4_4_ * fVar56;
          auVar48._8_4_ = fVar136 * fStack_11e0 + auVar108._8_4_ * fVar57;
          auVar48._12_4_ = fVar137 * fStack_11dc + auVar108._12_4_ * fVar58;
          local_10f8 = *puVar2;
          uStack_10f0 = puVar2[1];
          auVar92 = vsubps_avx(auVar111,auVar61);
          auVar74 = vsubps_avx(auVar112,auVar77);
          auVar59 = vsubps_avx(auVar104,auVar115);
          auVar106 = vsubps_avx(auVar130,auVar111);
          auVar87 = vsubps_avx(auVar132,auVar112);
          auVar88 = vsubps_avx(auVar48,auVar104);
          fVar58 = auVar88._0_4_;
          fVar117 = auVar74._0_4_;
          auVar49._0_4_ = fVar117 * fVar58;
          fVar10 = auVar88._4_4_;
          fVar119 = auVar74._4_4_;
          auVar49._4_4_ = fVar119 * fVar10;
          fVar15 = auVar88._8_4_;
          fVar121 = auVar74._8_4_;
          auVar49._8_4_ = fVar121 * fVar15;
          fVar20 = auVar88._12_4_;
          fVar123 = auVar74._12_4_;
          auVar49._12_4_ = fVar123 * fVar20;
          fVar114 = auVar87._0_4_;
          fVar125 = auVar59._0_4_;
          auVar62._0_4_ = fVar125 * fVar114;
          fVar11 = auVar87._4_4_;
          fVar127 = auVar59._4_4_;
          auVar62._4_4_ = fVar127 * fVar11;
          fVar16 = auVar87._8_4_;
          fVar128 = auVar59._8_4_;
          auVar62._8_4_ = fVar128 * fVar16;
          fVar21 = auVar87._12_4_;
          fVar129 = auVar59._12_4_;
          auVar62._12_4_ = fVar129 * fVar21;
          local_1058 = vsubps_avx(auVar62,auVar49);
          fVar135 = auVar106._0_4_;
          auVar63._0_4_ = fVar125 * fVar135;
          fVar12 = auVar106._4_4_;
          auVar63._4_4_ = fVar127 * fVar12;
          fVar17 = auVar106._8_4_;
          auVar63._8_4_ = fVar128 * fVar17;
          fVar22 = auVar106._12_4_;
          auVar63._12_4_ = fVar129 * fVar22;
          fVar136 = auVar92._0_4_;
          auVar78._0_4_ = fVar58 * fVar136;
          fVar13 = auVar92._4_4_;
          auVar78._4_4_ = fVar10 * fVar13;
          fVar18 = auVar92._8_4_;
          auVar78._8_4_ = fVar15 * fVar18;
          fVar23 = auVar92._12_4_;
          auVar78._12_4_ = fVar20 * fVar23;
          auVar59 = vsubps_avx(auVar78,auVar63);
          auVar79._0_4_ = fVar114 * fVar136;
          auVar79._4_4_ = fVar11 * fVar13;
          auVar79._8_4_ = fVar16 * fVar18;
          auVar79._12_4_ = fVar21 * fVar23;
          auVar94._0_4_ = fVar117 * fVar135;
          auVar94._4_4_ = fVar119 * fVar12;
          auVar94._8_4_ = fVar121 * fVar17;
          auVar94._12_4_ = fVar123 * fVar22;
          local_11f8 = vsubps_avx(auVar94,auVar79);
          uVar30 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar95._4_4_ = uVar30;
          auVar95._0_4_ = uVar30;
          auVar95._8_4_ = uVar30;
          auVar95._12_4_ = uVar30;
          uVar30 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar50._4_4_ = uVar30;
          auVar50._0_4_ = uVar30;
          auVar50._8_4_ = uVar30;
          auVar50._12_4_ = uVar30;
          uVar30 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar138._4_4_ = uVar30;
          auVar138._0_4_ = uVar30;
          auVar138._8_4_ = uVar30;
          auVar138._12_4_ = uVar30;
          fVar47 = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_1208 = vsubps_avx(auVar111,auVar95);
          fVar56 = (ray->super_RayK<1>).dir.field_0.m128[2];
          _local_11d8 = vsubps_avx(auVar112,auVar50);
          _local_11e8 = vsubps_avx(auVar104,auVar138);
          fVar137 = local_11e8._0_4_;
          auVar105._0_4_ = fVar47 * fVar137;
          fVar14 = local_11e8._4_4_;
          auVar105._4_4_ = fVar47 * fVar14;
          fVar19 = local_11e8._8_4_;
          auVar105._8_4_ = fVar47 * fVar19;
          fVar24 = local_11e8._12_4_;
          auVar105._12_4_ = fVar47 * fVar24;
          fVar86 = local_11d8._0_4_;
          auVar139._0_4_ = fVar86 * fVar56;
          fVar96 = local_11d8._4_4_;
          auVar139._4_4_ = fVar96 * fVar56;
          fVar97 = local_11d8._8_4_;
          auVar139._8_4_ = fVar97 * fVar56;
          fVar98 = local_11d8._12_4_;
          auVar139._12_4_ = fVar98 * fVar56;
          auVar74 = vsubps_avx(auVar139,auVar105);
          fVar57 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar73 = local_1208._0_4_;
          auVar51._0_4_ = fVar73 * fVar56;
          fVar83 = local_1208._4_4_;
          auVar51._4_4_ = fVar83 * fVar56;
          fVar84 = local_1208._8_4_;
          auVar51._8_4_ = fVar84 * fVar56;
          fVar85 = local_1208._12_4_;
          auVar51._12_4_ = fVar85 * fVar56;
          auVar64._0_4_ = fVar137 * fVar57;
          auVar64._4_4_ = fVar14 * fVar57;
          auVar64._8_4_ = fVar19 * fVar57;
          auVar64._12_4_ = fVar24 * fVar57;
          auVar106 = vsubps_avx(auVar64,auVar51);
          auVar65._0_4_ = fVar86 * fVar57;
          auVar65._4_4_ = fVar96 * fVar57;
          auVar65._8_4_ = fVar97 * fVar57;
          auVar65._12_4_ = fVar98 * fVar57;
          auVar80._0_4_ = fVar47 * fVar73;
          auVar80._4_4_ = fVar47 * fVar83;
          auVar80._8_4_ = fVar47 * fVar84;
          auVar80._12_4_ = fVar47 * fVar85;
          auVar87 = vsubps_avx(auVar80,auVar65);
          auVar88 = local_11f8;
          auVar81._0_4_ =
               local_1058._0_4_ * fVar57 + fVar47 * auVar59._0_4_ + local_11f8._0_4_ * fVar56;
          auVar81._4_4_ =
               local_1058._4_4_ * fVar57 + fVar47 * auVar59._4_4_ + local_11f8._4_4_ * fVar56;
          auVar81._8_4_ =
               local_1058._8_4_ * fVar57 + fVar47 * auVar59._8_4_ + local_11f8._8_4_ * fVar56;
          auVar81._12_4_ =
               local_1058._12_4_ * fVar57 + fVar47 * auVar59._12_4_ + local_11f8._12_4_ * fVar56;
          auVar66._8_8_ = 0x8000000080000000;
          auVar66._0_8_ = 0x8000000080000000;
          auVar92 = vandps_avx(auVar81,auVar66);
          uVar29 = auVar92._0_4_;
          local_10e8._0_4_ =
               (float)(uVar29 ^ (uint)(fVar135 * auVar74._0_4_ +
                                      fVar114 * auVar106._0_4_ + fVar58 * auVar87._0_4_));
          uVar120 = auVar92._4_4_;
          local_10e8._4_4_ =
               (float)(uVar120 ^
                      (uint)(fVar12 * auVar74._4_4_ +
                            fVar11 * auVar106._4_4_ + fVar10 * auVar87._4_4_));
          uVar122 = auVar92._8_4_;
          local_10e8._8_4_ =
               (float)(uVar122 ^
                      (uint)(fVar17 * auVar74._8_4_ +
                            fVar16 * auVar106._8_4_ + fVar15 * auVar87._8_4_));
          uVar124 = auVar92._12_4_;
          local_10e8._12_4_ =
               (float)(uVar124 ^
                      (uint)(fVar22 * auVar74._12_4_ +
                            fVar21 * auVar106._12_4_ + fVar20 * auVar87._12_4_));
          local_10d8._0_4_ =
               (float)(uVar29 ^ (uint)(auVar74._0_4_ * fVar136 +
                                      fVar117 * auVar106._0_4_ + fVar125 * auVar87._0_4_));
          local_10d8._4_4_ =
               (float)(uVar120 ^
                      (uint)(auVar74._4_4_ * fVar13 +
                            fVar119 * auVar106._4_4_ + fVar127 * auVar87._4_4_));
          local_10d8._8_4_ =
               (float)(uVar122 ^
                      (uint)(auVar74._8_4_ * fVar18 +
                            fVar121 * auVar106._8_4_ + fVar128 * auVar87._8_4_));
          local_10d8._12_4_ =
               (float)(uVar124 ^
                      (uint)(auVar74._12_4_ * fVar23 +
                            fVar123 * auVar106._12_4_ + fVar129 * auVar87._12_4_));
          auVar106 = ZEXT816(0) << 0x20;
          auVar92 = vcmpps_avx(local_10e8,auVar106,5);
          auVar74 = vcmpps_avx(local_10d8,auVar106,5);
          auVar92 = vandps_avx(auVar92,auVar74);
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          local_10b8 = vandps_avx(auVar81,auVar67);
          auVar74 = vcmpps_avx(auVar106,auVar81,4);
          auVar92 = vandps_avx(auVar92,auVar74);
          auVar68._0_4_ = local_10e8._0_4_ + local_10d8._0_4_;
          auVar68._4_4_ = local_10e8._4_4_ + local_10d8._4_4_;
          auVar68._8_4_ = local_10e8._8_4_ + local_10d8._8_4_;
          auVar68._12_4_ = local_10e8._12_4_ + local_10d8._12_4_;
          auVar74 = vcmpps_avx(auVar68,local_10b8,2);
          auVar92 = vandps_avx(auVar92,auVar74);
          auVar25._8_8_ = uStack_1100;
          auVar25._0_8_ = local_1108;
          auVar25 = auVar25 & auVar92;
          context = local_11b0;
          if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar25[0xf] < '\0') {
            auVar26._8_8_ = uStack_1100;
            auVar26._0_8_ = local_1108;
            auVar92 = vandps_avx(auVar92,auVar26);
            local_10c8._0_4_ =
                 (float)(uVar29 ^ (uint)(local_1058._0_4_ * fVar73 +
                                        fVar86 * auVar59._0_4_ + fVar137 * local_11f8._0_4_));
            local_10c8._4_4_ =
                 (float)(uVar120 ^
                        (uint)(local_1058._4_4_ * fVar83 +
                              fVar96 * auVar59._4_4_ + fVar14 * local_11f8._4_4_));
            local_10c8._8_4_ =
                 (float)(uVar122 ^
                        (uint)(local_1058._8_4_ * fVar84 +
                              fVar97 * auVar59._8_4_ + fVar19 * local_11f8._8_4_));
            local_10c8._12_4_ =
                 (float)(uVar124 ^
                        (uint)(local_1058._12_4_ * fVar85 +
                              fVar98 * auVar59._12_4_ + fVar24 * local_11f8._12_4_));
            fVar47 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar56 = local_10b8._0_4_;
            auVar52._0_4_ = fVar56 * fVar47;
            fVar57 = local_10b8._4_4_;
            auVar52._4_4_ = fVar57 * fVar47;
            fVar58 = local_10b8._8_4_;
            auVar52._8_4_ = fVar58 * fVar47;
            fVar114 = local_10b8._12_4_;
            auVar52._12_4_ = fVar114 * fVar47;
            auVar74 = vcmpps_avx(auVar52,local_10c8,1);
            fVar47 = (ray->super_RayK<1>).tfar;
            auVar69._0_4_ = fVar56 * fVar47;
            auVar69._4_4_ = fVar57 * fVar47;
            auVar69._8_4_ = fVar58 * fVar47;
            auVar69._12_4_ = fVar114 * fVar47;
            auVar106 = vcmpps_avx(local_10c8,auVar69,2);
            auVar74 = vandps_avx(auVar106,auVar74);
            auVar106 = auVar92 & auVar74;
            if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar106[0xf] < '\0') {
              auVar5._0_4_ = (ray->super_RayK<1>).tfar;
              auVar5._4_4_ = (ray->super_RayK<1>).mask;
              auVar5._8_4_ = (ray->super_RayK<1>).id;
              auVar5._12_4_ = (ray->super_RayK<1>).flags;
              auVar72 = ZEXT1664(auVar5);
              auVar92 = vandps_avx(auVar92,auVar74);
              local_1098 = auVar92;
              local_1238 = auVar59._0_8_;
              uStack_1230 = auVar59._8_8_;
              local_1048 = local_1238;
              uStack_1040 = uStack_1230;
              local_1038 = local_11f8._0_8_;
              uStack_1030 = local_11f8._8_8_;
              local_11c8 = auVar92;
              auVar74 = vrcpps_avx(local_10b8);
              fVar47 = auVar74._0_4_;
              auVar70._0_4_ = fVar56 * fVar47;
              fVar56 = auVar74._4_4_;
              auVar70._4_4_ = fVar57 * fVar56;
              fVar57 = auVar74._8_4_;
              auVar70._8_4_ = fVar58 * fVar57;
              fVar58 = auVar74._12_4_;
              auVar70._12_4_ = fVar114 * fVar58;
              auVar82._8_4_ = 0x3f800000;
              auVar82._0_8_ = 0x3f8000003f800000;
              auVar82._12_4_ = 0x3f800000;
              auVar74 = vsubps_avx(auVar82,auVar70);
              fVar47 = fVar47 + fVar47 * auVar74._0_4_;
              fVar56 = fVar56 + fVar56 * auVar74._4_4_;
              fVar57 = fVar57 + fVar57 * auVar74._8_4_;
              fVar58 = fVar58 + fVar58 * auVar74._12_4_;
              local_1068._0_4_ = fVar47 * local_10c8._0_4_;
              local_1068._4_4_ = fVar56 * local_10c8._4_4_;
              local_1068._8_4_ = fVar57 * local_10c8._8_4_;
              local_1068._12_4_ = fVar58 * local_10c8._12_4_;
              auVar55 = ZEXT1664(local_1068);
              local_1088[0] = fVar47 * local_10e8._0_4_;
              local_1088[1] = fVar56 * local_10e8._4_4_;
              local_1088[2] = fVar57 * local_10e8._8_4_;
              local_1088[3] = fVar58 * local_10e8._12_4_;
              local_1078[0] = fVar47 * local_10d8._0_4_;
              local_1078[1] = fVar56 * local_10d8._4_4_;
              local_1078[2] = fVar57 * local_10d8._8_4_;
              local_1078[3] = fVar58 * local_10d8._12_4_;
              auVar53._8_4_ = 0x7f800000;
              auVar53._0_8_ = 0x7f8000007f800000;
              auVar53._12_4_ = 0x7f800000;
              auVar74 = vblendvps_avx(auVar53,local_1068,auVar92);
              auVar59 = vshufps_avx(auVar74,auVar74,0xb1);
              auVar59 = vminps_avx(auVar59,auVar74);
              auVar106 = vshufpd_avx(auVar59,auVar59,1);
              auVar59 = vminps_avx(auVar106,auVar59);
              auVar74 = vcmpps_avx(auVar74,auVar59,0);
              auVar59 = auVar92 & auVar74;
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar59[0xf] < '\0') {
                auVar92 = vandps_avx(auVar74,auVar92);
              }
              uVar29 = vextractps_avx(auVar5,1);
              uVar30 = vmovmskps_avx(auVar92);
              uVar32 = CONCAT44((int)((ulong)local_11b0 >> 0x20),uVar30);
              lVar42 = 0;
              local_11f8 = auVar88;
              _local_11a8 = auVar60;
              _local_fb8 = auVar76;
              _local_fa8 = auVar93;
              _local_f98 = auVar110;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                }
              }
LAB_00b6caf2:
              local_1120 = *(uint *)((long)&local_f88 + lVar42 * 4);
              auVar33 = (undefined1  [8])(ulong)local_1120;
              pGVar8 = (pSVar7->geometries).items[(long)auVar33].ptr;
              if ((pGVar8->mask & uVar29) == 0) {
                *(undefined4 *)(local_11c8 + lVar42 * 4) = 0;
              }
              else {
                pRVar9 = context->args;
                local_1208 = auVar72._0_16_;
                auVar92 = auVar55._0_16_;
                if (pRVar9->filter == (RTCFilterFunctionN)0x0) {
                  local_1168.context = context->user;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar47 = local_1088[lVar42];
                    fVar56 = local_1078[lVar42];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1068 + lVar42 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1058 + lVar42 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)((long)&local_1048 + lVar42 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)((long)&local_1038 + lVar42 * 4);
                    ray->u = fVar47;
                    ray->v = fVar56;
                    ray->primID = *(uint *)((long)&local_10f8 + lVar42 * 4);
                    ray->geomID = local_1120;
                    ray->instID[0] = (local_1168.context)->instID[0];
                    ray->instPrimID[0] = (local_1168.context)->instPrimID[0];
                    goto LAB_00b6c93f;
                  }
                }
                else {
                  local_1168.context = context->user;
                }
                local_1138 = *(float *)(local_1058 + lVar42 * 4);
                local_1134 = *(undefined4 *)((long)&local_1048 + lVar42 * 4);
                local_1130 = *(undefined4 *)((long)&local_1038 + lVar42 * 4);
                local_112c = local_1088[lVar42];
                local_1128 = local_1078[lVar42];
                local_1124 = *(undefined4 *)((long)&local_10f8 + lVar42 * 4);
                local_111c = (local_1168.context)->instID[0];
                local_1118 = (local_1168.context)->instPrimID[0];
                local_11f8._0_8_ = lVar42;
                (ray->super_RayK<1>).tfar = *(float *)(local_1068 + lVar42 * 4);
                local_120c = -1;
                local_1168.valid = &local_120c;
                auVar33 = (undefined1  [8])pGVar8->userPtr;
                local_1168.geometryUserPtr = (void *)auVar33;
                local_1168.ray = (RTCRayN *)ray;
                local_1168.hit = (RTCHitN *)&local_1138;
                local_1168.N = 1;
                local_11d8 = (undefined1  [8])pGVar8;
                if (((pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*pGVar8->intersectionFilterN)(&local_1168), *local_1168.valid != 0)) &&
                   ((pRVar9->filter == (RTCFilterFunctionN)0x0 ||
                    (((auVar33 = (undefined1  [8])pRVar9,
                      (pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      (auVar33 = local_11d8,
                      ((ulong)((RTCIntersectArguments *)((long)local_11d8 + 0x20))->intersect &
                      0x40000000000000) == 0)) ||
                     ((*pRVar9->filter)(&local_1168), *local_1168.valid != 0)))))) {
                  (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_1168.hit;
                  (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_1168.hit + 4);
                  (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_1168.hit + 8);
                  *(float *)((long)local_1168.ray + 0x3c) = *(float *)(local_1168.hit + 0xc);
                  *(float *)((long)local_1168.ray + 0x40) = *(float *)(local_1168.hit + 0x10);
                  *(float *)((long)local_1168.ray + 0x44) = *(float *)(local_1168.hit + 0x14);
                  *(float *)((long)local_1168.ray + 0x48) = *(float *)(local_1168.hit + 0x18);
                  *(float *)((long)local_1168.ray + 0x4c) = *(float *)(local_1168.hit + 0x1c);
                  auVar33 = (undefined1  [8])0x0;
                  *(float *)((long)local_1168.ray + 0x50) = *(float *)(local_1168.hit + 0x20);
                }
                else {
                  (ray->super_RayK<1>).tfar = (float)local_1208._0_4_;
                }
                *(undefined4 *)(local_11c8 + local_11f8._0_8_ * 4) = 0;
                fVar47 = (ray->super_RayK<1>).tfar;
                auVar54._4_4_ = fVar47;
                auVar54._0_4_ = fVar47;
                auVar54._8_4_ = fVar47;
                auVar54._12_4_ = fVar47;
                auVar55 = ZEXT1664(auVar92);
                auVar92 = vcmpps_avx(auVar92,auVar54,2);
                local_11c8 = vandps_avx(auVar92,local_11c8);
                auVar6._0_4_ = (ray->super_RayK<1>).tfar;
                auVar6._4_4_ = (ray->super_RayK<1>).mask;
                auVar6._8_4_ = (ray->super_RayK<1>).id;
                auVar6._12_4_ = (ray->super_RayK<1>).flags;
                auVar72 = ZEXT1664(auVar6);
                uVar29 = vextractps_avx(auVar6,1);
                context = local_11b0;
              }
              if ((((local_11c8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_11c8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_11c8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_11c8[0xf]) goto LAB_00b6c93f;
              auVar71._8_4_ = 0x7f800000;
              auVar71._0_8_ = 0x7f8000007f800000;
              auVar71._12_4_ = 0x7f800000;
              auVar92 = vblendvps_avx(auVar71,auVar55._0_16_,local_11c8);
              auVar74 = vshufps_avx(auVar92,auVar92,0xb1);
              auVar74 = vminps_avx(auVar74,auVar92);
              auVar59 = vshufpd_avx(auVar74,auVar74,1);
              auVar74 = vminps_avx(auVar59,auVar74);
              auVar74 = vcmpps_avx(auVar92,auVar74,0);
              auVar59 = local_11c8 & auVar74;
              auVar92 = local_11c8;
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar59[0xf] < '\0') {
                auVar92 = vandps_avx(auVar74,local_11c8);
              }
              uVar30 = vmovmskps_avx(auVar92);
              uVar32 = CONCAT44((int)((ulong)auVar33 >> 0x20),uVar30);
              lVar42 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                }
              }
              goto LAB_00b6caf2;
            }
          }
LAB_00b6c93f:
          auVar113 = ZEXT1664(local_fc8);
          auVar116 = ZEXT1664(local_fd8);
          auVar118 = ZEXT1664(local_fe8);
          auVar126 = ZEXT1664(local_ff8);
          auVar131 = ZEXT1664(local_1008);
          auVar133 = ZEXT1664(local_1018);
          auVar134 = ZEXT1664(local_1028);
          uVar32 = local_1198;
        }
        fVar47 = (ray->super_RayK<1>).tfar;
        auVar55 = ZEXT1664(CONCAT412(fVar47,CONCAT48(fVar47,CONCAT44(fVar47,fVar47))));
        auVar72 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_00b6c132;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }